

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_valddi.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::zetDebugWriteMemory
          (validation_layer *this,zet_debug_session_handle_t hDebug,ze_device_thread_t thread,
          zet_debug_memory_space_desc_t *desc,size_t size,void *buffer)

{
  long lVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  long *plVar5;
  ze_device_thread_t thread_00;
  ze_result_t zVar6;
  ze_result_t result;
  zet_debug_memory_space_desc_t *desc_00;
  undefined8 uVar7;
  ze_result_t unaff_EBP;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  ze_result_t local_b4;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar4 = context;
  desc_00 = thread._8_8_;
  uVar7 = thread._0_8_;
  lVar2 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zetDebugWriteMemory(hDebug, thread, desc, size, buffer)","");
  if (*(char *)(lVar2 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar2 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar3 = *(code **)(lVar4 + 0x860);
  if (pcVar3 == (code *)0x0) {
    zVar6 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar2 = *(long *)(lVar4 + 0xd30);
    lVar4 = *(long *)(lVar4 + 0xd38);
    uVar9 = lVar4 - lVar2 >> 3;
    bVar10 = lVar4 != lVar2;
    local_b4 = unaff_EBP;
    if (bVar10) {
      uVar8 = 1;
      do {
        plVar5 = *(long **)(*(long *)(*(long *)(context + 0xd30) + -8 + uVar8 * 8) + 0x10);
        local_b4 = (**(code **)(*plVar5 + 0x90))(plVar5,this,hDebug,uVar7,desc_00,desc,size);
        if (local_b4 != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zetDebugWriteMemory",local_b4);
          break;
        }
        bVar10 = uVar8 < uVar9;
        lVar1 = (-(ulong)(uVar9 == 0) - uVar9) + uVar8;
        uVar8 = uVar8 + 1;
        local_b4 = unaff_EBP;
      } while (lVar1 != 0);
    }
    if (bVar10) {
      return local_b4;
    }
    if ((*(char *)(context + 4) == '\x01') &&
       (thread_00.eu = (int)uVar7, thread_00.thread = (int)((ulong)uVar7 >> 0x20),
       thread_00._0_8_ = hDebug,
       zVar6 = ZETHandleLifetimeValidation::zetDebugWriteMemoryPrologue
                         ((ZETHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 0x10),
                          (zet_debug_session_handle_t)this,thread_00,desc_00,(size_t)desc,
                          (void *)size), zVar6 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zetDebugWriteMemory",zVar6);
      return zVar6;
    }
    zVar6 = (*pcVar3)(this,hDebug,uVar7,desc_00,desc,size);
    bVar10 = lVar4 != lVar2;
    if (bVar10) {
      uVar8 = 1;
      do {
        plVar5 = *(long **)(*(long *)(*(long *)(context + 0xd30) + -8 + uVar8 * 8) + 0x10);
        result = (**(code **)(*plVar5 + 0x98))(plVar5,this,hDebug,uVar7,desc_00,desc,size,zVar6);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zetDebugWriteMemory",result);
          local_b4 = result;
          break;
        }
        bVar10 = uVar8 < uVar9;
        lVar2 = uVar8 + (-(ulong)(uVar9 == 0) - uVar9);
        uVar8 = uVar8 + 1;
      } while (lVar2 != 0);
    }
    if (bVar10) {
      return local_b4;
    }
  }
  logAndPropagateResult("zetDebugWriteMemory",zVar6);
  return zVar6;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDebugWriteMemory(
        zet_debug_session_handle_t hDebug,              ///< [in] debug session handle
        ze_device_thread_t thread,                      ///< [in] the thread identifier.
        const zet_debug_memory_space_desc_t* desc,      ///< [in] memory space descriptor
        size_t size,                                    ///< [in] the number of bytes to write
        const void* buffer                              ///< [in] a buffer holding the pattern to write
        )
    {
        context.logger->log_trace("zetDebugWriteMemory(hDebug, thread, desc, size, buffer)");

        auto pfnWriteMemory = context.zetDdiTable.Debug.pfnWriteMemory;

        if( nullptr == pfnWriteMemory )
            return logAndPropagateResult("zetDebugWriteMemory", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetDebugWriteMemoryPrologue( hDebug, thread, desc, size, buffer );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetDebugWriteMemory", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zetHandleLifetime.zetDebugWriteMemoryPrologue( hDebug, thread, desc, size, buffer );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetDebugWriteMemory", result);
        }

        auto driver_result = pfnWriteMemory( hDebug, thread, desc, size, buffer );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetDebugWriteMemoryEpilogue( hDebug, thread, desc, size, buffer ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetDebugWriteMemory", result);
        }

        return logAndPropagateResult("zetDebugWriteMemory", driver_result);
    }